

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

void close_window(WindowHandle *h_wnd)

{
  WindowHandleData *this;
  WindowHandle *h_wnd_local;
  
  if (*h_wnd != (WindowHandle)0x0) {
    std::mutex::lock(&(*h_wnd)->mt);
    if ((*h_wnd)->listener != (IWindowListener *)0x0) {
      (*(code *)**(undefined8 **)(*h_wnd)->listener)();
    }
    std::atomic<bool>::operator=(&(*h_wnd)->quit,true);
    std::mutex::unlock(&(*h_wnd)->mt);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->(&(*h_wnd)->t);
    std::thread::join();
    this = *h_wnd;
    if (this != (WindowHandleData *)0x0) {
      WindowHandleData::~WindowHandleData(this);
      operator_delete(this,0xd8);
    }
    *h_wnd = (WindowHandle)0x0;
  }
  return;
}

Assistant:

void close_window(WindowHandle& h_wnd)
  {
  if (h_wnd)
    {
#ifdef _WIN32
    PostMessage(h_wnd->h_wnd, WM_CLOSE, NULL, NULL);
#else
    h_wnd->mt.lock();
    if (h_wnd->listener)
      h_wnd->listener->OnClose();    
    h_wnd->quit = true;
    h_wnd->mt.unlock();
#endif
    h_wnd->t->join();
    delete h_wnd;
    h_wnd = nullptr;
    }
  }